

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SchemaValidator.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::SchemaValidator::SchemaValidator
          (SchemaValidator *this,XMLErrorReporter *errReporter,MemoryManager *manager)

{
  ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *pVVar1;
  
  XMLValidator::XMLValidator(&this->super_XMLValidator,errReporter);
  (this->super_XMLValidator)._vptr_XMLValidator = (_func_int **)&PTR__SchemaValidator_00408170;
  this->fMemoryManager = manager;
  this->fSchemaGrammar = (SchemaGrammar *)0x0;
  this->fGrammarResolver = (GrammarResolver *)0x0;
  *(undefined8 *)((long)&this->fGrammarResolver + 2) = 0;
  *(undefined8 *)((long)&this->fXsiType + 2) = 0;
  this->fCurrentDatatypeValidator = (DatatypeValidator *)0x0;
  this->fNotationBuf = (XMLBuffer *)0x0;
  XMLBuffer::XMLBuffer(&this->fDatatypeBuffer,0x3ff,manager);
  this->fTrailing = false;
  this->fSeenNonWhiteSpace = false;
  this->fSeenId = false;
  XSDErrorReporter::XSDErrorReporter(&this->fSchemaErrorReporter,(XMLErrorReporter *)0x0);
  this->fTypeStack = (ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)0x0;
  this->fMostRecentAttrValidator = (DatatypeValidator *)0x0;
  this->fErrorOccurred = false;
  this->fElemIsSpecified = false;
  pVVar1 = (ValueStackOf<xercesc_4_0::ComplexTypeInfo_*> *)
           XMemory::operator_new(0x30,this->fMemoryManager);
  ValueVectorOf<xercesc_4_0::ComplexTypeInfo_*>::ValueVectorOf
            (&pVVar1->fVector,8,this->fMemoryManager,false);
  this->fTypeStack = pVVar1;
  return;
}

Assistant:

SchemaValidator::SchemaValidator( XMLErrorReporter* const errReporter
                                , MemoryManager* const    manager) :

    XMLValidator(errReporter)
    , fMemoryManager(manager)
    , fSchemaGrammar(0)
    , fGrammarResolver(0)
    , fXsiType(0)
    , fNil(false)
    , fNilFound(false)
    , fCurrentDatatypeValidator(0)
    , fNotationBuf(0)
    , fDatatypeBuffer(1023, manager)
    , fTrailing(false)
    , fSeenNonWhiteSpace(false)
    , fSeenId(false)
    , fTypeStack(0)
    , fMostRecentAttrValidator(0)
    , fErrorOccurred(false)
    , fElemIsSpecified(false)
{
    fTypeStack = new (fMemoryManager) ValueStackOf<ComplexTypeInfo*>(8, fMemoryManager);
}